

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O0

bool testing::internal::ParseGoogleMockFlag<std::__cxx11::string>
               (char *str,char *flag_name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  char *__s;
  char *value_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  char *flag_name_local;
  char *str_local;
  
  __s = ParseGoogleMockFlagValue(str,flag_name,false);
  if (__s != (char *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (value,__s);
  }
  return __s != (char *)0x0;
}

Assistant:

static bool ParseGoogleMockFlag(const char* str, const char* flag_name,
                                String* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag_name, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}